

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrVec.h
# Opt level: O2

StrVec * __thiscall StrVec::operator=(StrVec *this,StrVec *rhs)

{
  ostream *poVar1;
  string *b;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"StrVec copy assignment.");
  std::endl<char,std::char_traits<char>>(poVar1);
  b = rhs->elements;
  pVar2 = alloc_n_copy(this,b,rhs->first_free);
  free(this,b);
  this->elements = pVar2.first;
  this->cap = pVar2.second;
  this->first_free = pVar2.second;
  return this;
}

Assistant:

inline
StrVec& StrVec::operator=(const StrVec& rhs)
{
	std::cout << "StrVec copy assignment." << std::endl;
	// call alloc_n_copy to allocate exactly as many elements as in rhs
	auto data = alloc_n_copy(rhs.begin(), rhs.end());
	free();
	elements = data.first;
	first_free = cap = data.second;
	return *this;
}